

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qcolumnviewgrip_p.cpp
# Opt level: O1

int __thiscall QColumnViewGrip::qt_metacall(QColumnViewGrip *this,Call _c,int _id,void **_a)

{
  int iVar1;
  QColumnViewGrip *_t;
  long in_FS_OFFSET;
  undefined4 local_3c;
  void *local_38;
  undefined4 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = QWidget::qt_metacall((QWidget *)this,_c,_id,_a);
  if (-1 < iVar1) {
    if (_c == InvokeMetaMethod) {
      if (iVar1 == 0) {
        local_3c = *_a[1];
        puStack_30 = &local_3c;
        local_38 = (void *)0x0;
        QMetaObject::activate((QObject *)this,&staticMetaObject,0,&local_38);
      }
      iVar1 = iVar1 + -1;
    }
    if (_c == RegisterMethodArgumentMetaType) {
      if (iVar1 < 1) {
        *(undefined8 *)*_a = 0;
      }
      iVar1 = iVar1 + -1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int QColumnViewGrip::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QWidget::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 1)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 1;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 1)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 1;
    }
    return _id;
}